

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_double(void)

{
  byte bVar1;
  int iVar2;
  undefined8 uVar3;
  char *__s1;
  char *__s2;
  char *expected;
  char *str;
  bson_t *b;
  size_t len;
  
  uVar3 = bson_new();
  bVar1 = bson_append_double(0x405ee00000000000,uVar3,"foo",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x177,"test_bson_as_json_double","bson_append_double (b, \"foo\", -1, 123.5)");
    abort();
  }
  bVar1 = bson_append_double(0x4008000000000000,uVar3,"bar",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x178,"test_bson_as_json_double","bson_append_double (b, \"bar\", -1, 3)");
    abort();
  }
  bVar1 = bson_append_double(0xbff0000000000000,uVar3,"baz",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x179,"test_bson_as_json_double","bson_append_double (b, \"baz\", -1, -1)");
    abort();
  }
  bVar1 = bson_append_double(0x3fa0000000000000,uVar3,"quux",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x17a,"test_bson_as_json_double","bson_append_double (b, \"quux\", -1, 0.03125)");
    abort();
  }
  bVar1 = bson_append_double(0x547d42aea2879f2e,uVar3,"huge",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x17b,"test_bson_as_json_double","bson_append_double (b, \"huge\", -1, 1e99)");
    abort();
  }
  __s1 = (char *)bson_as_json(uVar3,&b);
  __s2 = (char *)bson_strdup_printf(0x547d42aea2879f2e,
                                    "{ \"foo\" : 123.5, \"bar\" : 3.0, \"baz\" : -1.0, \"quux\" : 0.03125, \"huge\" : %.20g }"
                                   );
  if (__s1 != __s2) {
    iVar2 = strcmp(__s1,__s2);
    if (iVar2 != 0) {
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" != \"%s\"\n",__s1,__s2);
      abort();
    }
  }
  bson_free(__s2);
  bson_free(__s1);
  bson_destroy(uVar3);
  return;
}

Assistant:

static void
test_bson_as_json_double (void)
{
   size_t len;
   bson_t *b;
   char *str;
   char *expected;

   b = bson_new ();
   BSON_ASSERT (bson_append_double (b, "foo", -1, 123.5));
   BSON_ASSERT (bson_append_double (b, "bar", -1, 3));
   BSON_ASSERT (bson_append_double (b, "baz", -1, -1));
   BSON_ASSERT (bson_append_double (b, "quux", -1, 0.03125));
   BSON_ASSERT (bson_append_double (b, "huge", -1, 1e99));
   str = bson_as_json (b, &len);

   expected = bson_strdup_printf ("{"
                                  " \"foo\" : 123.5,"
                                  " \"bar\" : 3.0,"
                                  " \"baz\" : -1.0,"
                                  " \"quux\" : 0.03125,"
                                  " \"huge\" : %.20g }",
                                  1e99);

   ASSERT_CMPSTR (str, expected);

   bson_free (expected);
   bson_free (str);
   bson_destroy (b);
}